

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

void ** adt_hash_get(adt_hash_t *self,char *pKey)

{
  uint32_t u32Hash;
  adt_hkey_t *paVar1;
  adt_hkey_t *hkey;
  uint32_t u32HashVal;
  char *pKey_local;
  adt_hash_t *self_local;
  
  if ((self != (adt_hash_t *)0x0) && (pKey != (char *)0x0)) {
    u32Hash = adt_hash_string(pKey);
    paVar1 = adt_hnode_find(self->root,pKey,u32Hash);
    if (paVar1 != (adt_hkey_t *)0x0) {
      return &paVar1->val;
    }
  }
  return (void **)0x0;
}

Assistant:

void**	adt_hash_get(const adt_hash_t *self, const char *pKey){
	if(self && pKey){
		uint32_t u32HashVal = adt_hash_string(pKey);
		adt_hkey_t *hkey = adt_hnode_find(self->root,pKey,u32HashVal);
		if(hkey){
			return &hkey->val;
		}
	}
	return (void**)0;
}